

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void SubtractionHelper<long,_unsigned_char,_19>::
     SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (long *lhs,uchar *rhs,uchar *result)

{
  byte bVar1;
  long lVar2;
  undefined1 *in_RDX;
  byte *in_RSI;
  long *in_RDI;
  uint64_t tmp;
  
  lVar2 = *in_RDI - (ulong)*in_RSI;
  bVar1 = std::numeric_limits<unsigned_char>::max();
  if (lVar2 <= (long)(ulong)bVar1) {
    bVar1 = std::numeric_limits<unsigned_char>::min();
    if ((long)(ulong)bVar1 <= lVar2) {
      *in_RDX = (char)lVar2;
      return;
    }
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const U& lhs, const T& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // Do this as unsigned to prevent unwanted optimizations
        std::uint64_t tmp = (std::uint64_t)lhs - (std::uint64_t)rhs;

        if( (std::int64_t)tmp <= std::numeric_limits<T>::max() && (std::int64_t)tmp >= std::numeric_limits<T>::min() )
        {
            result = (T)(std::int64_t)tmp;
            return;
        }

        E::SafeIntOnOverflow();
    }